

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O1

TPZGeoMesh * __thiscall
TPZAcademicGeoMesh::RedBlackPyramidalAndHexagonalMesh(TPZAcademicGeoMesh *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  TPZAcademicGeoMesh *this_00;
  TPZGeoMesh *pTVar6;
  TPZGeoNode *pTVar7;
  int i;
  long nelem;
  int inode;
  long lVar8;
  long lVar9;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_01;
  int iVar10;
  int iVar11;
  int iVar12;
  TPZManVector<long,_8> nodes;
  TPZManVector<long,_5> el_nodes;
  TPZManVector<int,_8> indexes;
  TPZStack<int,_10> perm;
  int64_t index;
  TPZManVector<double,_3> x;
  TPZVec<long> local_228;
  int64_t local_208 [8];
  _func_int **local_1c8;
  TPZVec<long> local_1c0;
  int64_t local_1a0;
  int64_t local_198;
  int64_t local_190;
  int64_t local_188;
  long local_180;
  undefined **local_178;
  long local_170;
  TPZGeoMesh *local_168;
  TPZVec<int> local_160;
  int local_140 [8];
  TPZAcademicGeoMesh *local_120;
  long local_118;
  long local_110;
  long local_108;
  double local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  TPZManVector<int,_10> local_d0;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  undefined1 local_70 [8];
  TPZManVector<double,_3> local_68;
  
  lVar2 = this->fNumberElements;
  uVar1 = this->fMaterialId;
  pTVar6 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(pTVar6);
  GenerateNodes(this,pTVar6);
  pTVar6->fDim = 3;
  nelem = (pTVar6->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_d0);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,0);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,1);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,3);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,2);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,4);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,5);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,7);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_d0,6);
  local_120 = this;
  TPZVec<int>::TPZVec(&local_160,0);
  local_160.fStore = local_140;
  local_178 = &PTR__TPZManVector_018e6580;
  local_160._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e6580;
  local_160.fNElements = 8;
  local_160.fNAlloc = 0;
  if (0 < lVar2) {
    local_170 = lVar2 + 1;
    local_100 = 0.5 / (double)lVar2;
    local_88 = (int)local_170 * (int)local_170;
    this_01 = &pTVar6->fNodeVec;
    lVar8 = 0;
    local_1c8 = (_func_int **)&PTR__TPZManVector_018b52d0;
    local_168 = pTVar6;
    iStack_84 = local_88;
    iStack_80 = local_88;
    iStack_7c = local_88;
    do {
      local_110 = lVar8 * local_170;
      lVar9 = 0;
      local_118 = lVar8;
      do {
        local_d8 = (lVar9 + local_110) * local_170;
        local_e0 = local_d8 + local_170;
        local_e8 = lVar9 + local_118;
        lVar8 = 0;
        local_108 = lVar9;
        do {
          iVar3 = (int)lVar8;
          iVar10 = (int)local_d8;
          *local_160.fStore = iVar3 + iVar10;
          lVar8 = lVar8 + 1;
          local_160.fStore[1] = iVar10 + (int)lVar8;
          iVar10 = (int)local_e0;
          local_160.fStore[2] = iVar10 + iVar3;
          local_160.fStore[3] = (int)lVar8 + iVar10;
          iVar10 = local_160.fStore[1] + iStack_84;
          iVar11 = local_160.fStore[2] + iStack_80;
          iVar12 = local_160.fStore[3] + iStack_7c;
          local_160.fStore[4] = *local_160.fStore + local_88;
          local_160.fStore[5] = iVar10;
          local_160.fStore[6] = iVar11;
          local_160.fStore[7] = iVar12;
          if ((iVar3 + (int)local_e8 & 1U) == 0) {
            TPZVec<long>::TPZVec(&local_228,0);
            local_228._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
            local_228.fStore = local_208;
            local_228.fNElements = 8;
            local_228.fNAlloc = 0;
            lVar9 = 0;
            local_f0 = lVar8;
            do {
              pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                 (&this_01->super_TPZChunkVector<TPZGeoNode,_10>,
                                  (long)local_160.fStore[local_d0.super_TPZVec<int>.fStore[lVar9]]);
              local_228.fStore[lVar9] = (long)pTVar7->fId;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 8);
            TPZManVector<double,_3>::TPZManVector(&local_68,3);
            pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_01->super_TPZChunkVector<TPZGeoNode,_10>,*local_228.fStore);
            TPZGeoNode::GetCoordinates(pTVar7,&local_68.super_TPZVec<double>);
            lVar8 = 0;
            do {
              local_68.super_TPZVec<double>.fStore[lVar8] =
                   local_68.super_TPZVec<double>.fStore[lVar8] + local_100;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            TPZAdmChunkVector<TPZGeoNode,_10>::Resize(this_01,(int)(nelem + 1));
            pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_01->super_TPZChunkVector<TPZGeoNode,_10>,nelem);
            TPZGeoNode::Initialize(pTVar7,&local_68.super_TPZVec<double>,pTVar6);
            pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_01->super_TPZChunkVector<TPZGeoNode,_10>,nelem);
            lVar8 = (long)pTVar7->fId;
            TPZVec<long>::TPZVec(&local_1c0,0);
            pTVar6 = local_168;
            local_1c0._vptr_TPZVec = local_1c8;
            local_1c0.fStore = &local_1a0;
            local_1c0.fNElements = 5;
            local_1c0.fNAlloc = 0;
            local_1a0 = *local_228.fStore;
            local_198 = local_228.fStore[1];
            local_190 = local_228.fStore[2];
            local_188 = local_228.fStore[3];
            local_180 = lVar8;
            local_f8 = nelem + 1;
            (*(local_168->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (local_168,5,&local_1c0,(ulong)uVar1,local_70,1);
            plVar5 = local_1c0.fStore;
            plVar4 = local_228.fStore;
            *local_1c0.fStore = *local_228.fStore;
            plVar5[1] = plVar4[3];
            plVar5[2] = plVar4[7];
            plVar5[3] = plVar4[4];
            plVar5[4] = lVar8;
            (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar6,5,&local_1c0,(ulong)uVar1,local_70,1);
            plVar5 = local_1c0.fStore;
            plVar4 = local_228.fStore;
            *local_1c0.fStore = *local_228.fStore;
            plVar5[1] = plVar4[1];
            plVar5[2] = plVar4[5];
            plVar5[3] = plVar4[4];
            plVar5[4] = lVar8;
            (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar6,5,&local_1c0,(ulong)uVar1,local_70,1);
            plVar5 = local_1c0.fStore;
            plVar4 = local_228.fStore;
            *local_1c0.fStore = local_228.fStore[1];
            plVar5[1] = plVar4[2];
            plVar5[2] = plVar4[6];
            plVar5[3] = plVar4[5];
            plVar5[4] = lVar8;
            (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar6,5,&local_1c0,(ulong)uVar1,local_70,1);
            plVar5 = local_1c0.fStore;
            plVar4 = local_228.fStore;
            *local_1c0.fStore = local_228.fStore[3];
            plVar5[1] = plVar4[2];
            plVar5[2] = plVar4[6];
            plVar5[3] = plVar4[7];
            plVar5[4] = lVar8;
            (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar6,5,&local_1c0,(ulong)uVar1,local_70,1);
            plVar5 = local_1c0.fStore;
            plVar4 = local_228.fStore;
            *local_1c0.fStore = local_228.fStore[4];
            plVar5[1] = plVar4[5];
            plVar5[2] = plVar4[6];
            plVar5[3] = plVar4[7];
            plVar5[4] = lVar8;
            (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar6,5,&local_1c0,(ulong)uVar1,local_70,1);
            lVar8 = local_f0;
            if (local_1c0.fStore == &local_1a0) {
              local_1c0.fStore = (int64_t *)0x0;
            }
            local_1c0.fNAlloc = 0;
            local_1c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
            if (local_1c0.fStore != (int64_t *)0x0) {
              operator_delete__(local_1c0.fStore);
            }
            TPZManVector<double,_3>::~TPZManVector(&local_68);
            pTVar6 = local_168;
            if (local_228.fStore == local_208) {
              local_228.fStore = (int64_t *)0x0;
            }
            local_228.fNAlloc = 0;
            local_228._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
            nelem = local_f8;
            if (local_228.fStore != (int64_t *)0x0) {
              operator_delete__(local_228.fStore);
              nelem = local_f8;
            }
          }
          else {
            TPZVec<long>::TPZVec(&local_228,0);
            local_228._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
            local_228.fStore = local_208;
            local_228.fNElements = 8;
            local_228.fNAlloc = 0;
            lVar9 = 0;
            do {
              pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                 (&this_01->super_TPZChunkVector<TPZGeoNode,_10>,
                                  (long)local_160.fStore[local_d0.super_TPZVec<int>.fStore[lVar9]]);
              local_228.fStore[lVar9] = (long)pTVar7->fId;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 8);
            (*(pTVar6->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar6,7,&local_228,(ulong)uVar1,&local_1c0,1);
            if (local_228.fStore == local_208) {
              local_228.fStore = (int64_t *)0x0;
            }
            local_228.fNAlloc = 0;
            local_228._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
            if (local_228.fStore != (int64_t *)0x0) {
              operator_delete__(local_228.fStore);
            }
          }
        } while (lVar8 != lVar2);
        lVar9 = local_108 + 1;
      } while (lVar9 != lVar2);
      lVar8 = local_118 + 1;
    } while (lVar8 != lVar2);
  }
  TPZGeoMesh::BuildConnectivity(pTVar6);
  this_00 = local_120;
  AddBoundaryElements(local_120,pTVar6);
  if (this_00->fShouldDeform == true) {
    DeformGMesh(this_00,pTVar6);
  }
  if (local_160.fStore == local_140) {
    local_160.fStore = (int *)0x0;
  }
  local_160.fNAlloc = 0;
  local_160._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_160.fStore != (int *)0x0) {
    operator_delete__(local_160.fStore);
  }
  TPZManVector<int,_10>::~TPZManVector(&local_d0);
  return pTVar6;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::RedBlackPyramidalAndHexagonalMesh(){
    
    int64_t n = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    GenerateNodes(gmesh);
    gmesh->SetDimension(3);
    
    int64_t s = n + 1;
    REAL dir = 1.0;
    REAL dx = 0.5/n;
    int64_t n_nodes = gmesh->NNodes();
    TPZStack<int> perm;
    perm.push_back(0);
    perm.push_back(1);
    perm.push_back(3);
    perm.push_back(2);
    perm.push_back(4);
    perm.push_back(5);
    perm.push_back(7);
    perm.push_back(6);
    
    TPZManVector<int,8> indexes(8);
    for (int k = 0; k < n; k++) {
        for (int j = 0; j < n; j++) {
            for (int i = 0; i < n; i++) {
                
                int stride =  j*s + k*s*s;
                indexes[0] = i + stride;
                indexes[1] = i + 1 + stride;
                indexes[2] = i + s + stride;
                indexes[3] = i + 1 + s + stride;
                for (int l = 0; l < 4; l++) { // Vertical stride
                    indexes[l+4] = indexes[l]+s*s;
                }
                
                bool is_even_Q = (i+j+k)%2==0;
                if (is_even_Q) {
                    
                    TPZManVector<int64_t,8> nodes(8);
                    for (int inode=0; inode<8; inode++) {
                        nodes[inode] = gmesh->NodeVec()[indexes[perm[inode]]].Id();
                    }
                    
                    // Adding center point
                    TPZManVector<REAL,3> x(3);
                    gmesh->NodeVec()[nodes[0]].GetCoordinates(x);
                    for (int i = 0; i < 3; i++) {
                        x[i]+=dx*dir;
                    }
                    
                    gmesh->NodeVec().Resize(n_nodes+1);
                    gmesh->NodeVec()[n_nodes].Initialize(x, *gmesh);
                    int center_id = gmesh->NodeVec()[n_nodes].Id();
                    n_nodes++;
                    
                    // inserting Pyramids
                    int64_t index;
                    TPZManVector<int64_t,5> el_nodes(5);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[1];
                    el_nodes[2] = nodes[2];
                    el_nodes[3] = nodes[3];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[3];
                    el_nodes[2] = nodes[7];
                    el_nodes[3] = nodes[4];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[1];
                    el_nodes[2] = nodes[5];
                    el_nodes[3] = nodes[4];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[1];
                    el_nodes[1] = nodes[2];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[5];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[3];
                    el_nodes[1] = nodes[2];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[7];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[4];
                    el_nodes[1] = nodes[5];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[7];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    
                }else{
                    TPZManVector<int64_t,8> el_nodes(8);
                    int64_t index;
                    for (int inode=0; inode<8; inode++) {
                        el_nodes[inode] = gmesh->NodeVec()[indexes[perm[inode]]].Id();
                    }
                    gmesh->CreateGeoElement(ECube, el_nodes, MaterialId, index);
                }
                
            }
        }
    }
    
    gmesh->BuildConnectivity();
    AddBoundaryElements(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    
    return gmesh;
}